

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,std::optional<supermap::ByteArray<3ul>>,supermap::ByteArray<3ul>>
          (ResultBuilder *this,optional<supermap::ByteArray<3UL>_> *lhs,ByteArray<3UL> *rhs)

{
  __optional_eq_t<supermap::ByteArray<3UL>,_supermap::ByteArray<3UL>_> _Var1;
  ContextOptions *pCVar2;
  ByteArray<3UL> *in_R8;
  String SStack_38;
  
  _Var1 = std::operator==(lhs,rhs);
  (this->super_AssertData).m_failed = !_Var1;
  if ((_Var1) && (pCVar2 = getContextOptions(), pCVar2->success != true)) {
    return;
  }
  stringifyBinaryExpr<std::optional<supermap::ByteArray<3ul>>,supermap::ByteArray<3ul>>
            (&SStack_38,(detail *)lhs,(optional<supermap::ByteArray<3UL>_> *)0x1a184a,(char *)rhs,
             in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }